

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mchain_details.hpp
# Opt level: O1

void __thiscall
so_5::mchain_props::details::limited_preallocated_demand_queue::limited_preallocated_demand_queue
          (limited_preallocated_demand_queue *this,capacity_t *capacity)

{
  atomic_refcounted_t *paVar1;
  allocator_type local_31;
  value_type local_30;
  
  local_30.m_msg_type._M_target = (type_info *)&void::typeinfo;
  local_30.m_message_ref.m_obj = (message_t *)0x0;
  local_30.m_demand_type = event;
  std::vector<so_5::mchain_props::demand_t,_std::allocator<so_5::mchain_props::demand_t>_>::vector
            (&this->m_storage,capacity->m_max_size,&local_30,&local_31);
  if (local_30.m_message_ref.m_obj != (message_t *)0x0) {
    LOCK();
    paVar1 = &(local_30.m_message_ref.m_obj)->super_atomic_refcounted_t;
    (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i =
         (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i - 1;
    UNLOCK();
    if (((paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i == 0) &&
       (local_30.m_message_ref.m_obj != (message_t *)0x0)) {
      (*(local_30.m_message_ref.m_obj)->_vptr_message_t[1])();
    }
  }
  this->m_max_size = capacity->m_max_size;
  this->m_head = 0;
  this->m_size = 0;
  return;
}

Assistant:

limited_preallocated_demand_queue(
			const capacity_t & capacity )
			:	m_storage( capacity.max_size(), demand_t{} )
			,	m_max_size{ capacity.max_size() }
			,	m_head{ 0 }
			,	m_size{ 0 }
			{}